

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

optional<slang::ast::SequenceRange> __thiscall
slang::ast::SequenceConcatExpr::computeSequenceLengthImpl(SequenceConcatExpr *this)

{
  uint32_t uVar1;
  _Optional_base<slang::ast::SequenceRange,_true,_true> _Var2;
  uint *puVar3;
  pointer pEVar4;
  ulong uVar5;
  pointer pEVar6;
  byte bVar7;
  int iVar8;
  undefined4 uStack_5c;
  NondegeneracyCheckResult local_50;
  
  uVar5 = 0;
  iVar8 = 0;
  pEVar4 = (this->elements)._M_ptr;
  for (pEVar6 = pEVar4; pEVar6 != pEVar4 + (this->elements)._M_extent._M_extent_value;
      pEVar6 = pEVar6 + 1) {
    AssertionExpr::checkNondegeneracy(&local_50,(pEVar6->sequence).ptr);
    bVar7 = (byte)local_50.status.m_bits;
    pEVar4 = (this->elements)._M_ptr;
    if ((local_50.status.m_bits & 2) == 0 && pEVar6 == pEVar4) {
      uVar5 = 1;
      iVar8 = 1;
    }
    uVar1 = (pEVar6->delay).min;
    if ((pEVar6->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      puVar3 = std::optional<unsigned_int>::value(&(pEVar6->delay).max);
      uVar5 = (ulong)(((int)uVar5 + *puVar3) - (uint)(*puVar3 != 0 & bVar7 >> 1));
      pEVar4 = (this->elements)._M_ptr;
    }
    iVar8 = (iVar8 + uVar1) - (uint)(bVar7 >> 1 & uVar1 != 0);
  }
  uStack_5c = CONCAT31(uStack_5c._1_3_,1);
  _Var2._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._M_value.max.
  super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (optional<unsigned_int>)(optional<unsigned_int>)(uVar5 | 0x100000000);
  _Var2._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._M_value.min =
       iVar8;
  _Var2._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._12_4_ = uStack_5c;
  return (_Optional_base<slang::ast::SequenceRange,_true,_true>)
         (_Optional_base<slang::ast::SequenceRange,_true,_true>)
         _Var2._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>;
}

Assistant:

std::optional<SequenceRange> SequenceConcatExpr::computeSequenceLengthImpl() const {
    uint32_t delayMin = 0;
    uint32_t delayMax = 0;
    for (auto it = elements.begin(); it != elements.end(); it++) {
        const bool acceptsOnlyEmpty = it->sequence->checkNondegeneracy().status.has(
            NondegeneracyStatus::AcceptsOnlyEmpty);

        // Default delay length for concat sequence is 1 if it admits a non-empty match.
        if (it == elements.begin() && !acceptsOnlyEmpty)
            delayMin = delayMax = 1;

        // (empty ##n seq), where n is greater than 0, is equivalent to (##(n-1) seq).
        // Also ((##n empty) ; (seq ##n empty)), where n is greater than 0, is equivalent to
        // ((##(n-1) `true) ; (seq ##(n-1) `true))
        delayMin += (it->delay.min && acceptsOnlyEmpty) ? it->delay.min - 1 : it->delay.min;
        if (it->delay.max.has_value()) {
            const auto maxVal = it->delay.max.value();
            delayMax += (maxVal && acceptsOnlyEmpty) ? maxVal - 1 : maxVal;
        }
    }

    SequenceRange res;
    res.min = delayMin;
    res.max = delayMax;
    return res;
}